

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O1

ssize_t xread(file_stream *strm,void *buf,size_t count)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  size_t __nbytes;
  
  if (count == 0) {
    return 0;
  }
  __nbytes = 0x7fffffff;
  if (count < 0x7fffffff) {
    __nbytes = count;
  }
  sVar2 = read(strm->fd,buf,__nbytes);
  if (sVar2 == 0) {
    uVar1 = 3;
  }
  else if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 2;
    if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
      msg_errno("Error reading from %s",strm->name);
      sVar4 = (*(code *)&LAB_001066c6)();
      return sVar4;
    }
  }
  else {
    uVar1 = 0;
  }
  sVar4 = (*(code *)((long)&DAT_0010e7bc + (long)(int)(&DAT_0010e7bc)[uVar1]))();
  return sVar4;
}

Assistant:

ssize_t
xread(struct file_stream *strm, void *buf, size_t count)
{
	char *p = buf;
	size_t orig_count = count;

	while (count != 0) {
		ssize_t res = read(strm->fd, p, MIN(count, INT_MAX));
		if (res == 0)
			break;
		if (res < 0) {
			if (errno == EAGAIN || errno == EINTR)
				continue;
			msg_errno("Error reading from %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return orig_count - count;
}